

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

ArrayPtr<capnp::word> __thiscall
capnp::SchemaLoader::Impl::rewriteStructNodeWithSizes
          (Impl *this,Reader node,uint dataWordCount,uint pointerCount)

{
  Reader node_00;
  WiderType<Decay<unsigned_short>,_Decay<unsigned_int_&>_> WVar1;
  ArrayPtr<capnp::word> AVar2;
  Reader local_1b0;
  uint16_t local_17c;
  uint16_t local_17a;
  undefined1 local_178 [8];
  Builder newStruct;
  Builder root;
  undefined1 local_118 [8];
  MallocMessageBuilder builder;
  uint pointerCount_local;
  uint dataWordCount_local;
  Impl *this_local;
  
  builder.moreSegments.builder.disposer._0_4_ = pointerCount;
  builder.moreSegments.builder.disposer._4_4_ = dataWordCount;
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)local_118,0x400,GROW_HEURISTICALLY);
  MessageBuilder::setRoot<capnp::schema::Node::Reader&>((MessageBuilder *)local_118,&node);
  MessageBuilder::getRoot<capnp::schema::Node>
            ((Builder *)&newStruct._builder.dataSize,(MessageBuilder *)local_118);
  capnp::schema::Node::Builder::getStruct
            ((Builder *)local_178,(Builder *)&newStruct._builder.dataSize);
  local_17a = capnp::schema::Node::Struct::Builder::getDataWordCount((Builder *)local_178);
  WVar1 = kj::max<unsigned_short,unsigned_int&>
                    (&local_17a,(uint *)((long)&builder.moreSegments.builder.disposer + 4));
  capnp::schema::Node::Struct::Builder::setDataWordCount((Builder *)local_178,(uint16_t)WVar1);
  local_17c = capnp::schema::Node::Struct::Builder::getPointerCount((Builder *)local_178);
  WVar1 = kj::max<unsigned_short,unsigned_int&>
                    (&local_17c,(uint *)&builder.moreSegments.builder.disposer);
  capnp::schema::Node::Struct::Builder::setPointerCount((Builder *)local_178,(uint16_t)WVar1);
  capnp::schema::Node::Builder::operator_cast_to_Reader
            (&local_1b0,(Builder *)&newStruct._builder.dataSize);
  node_00._reader.capTable = local_1b0._reader.capTable;
  node_00._reader.segment = local_1b0._reader.segment;
  node_00._reader.data = local_1b0._reader.data;
  node_00._reader.pointers = local_1b0._reader.pointers;
  node_00._reader.dataSize = local_1b0._reader.dataSize;
  node_00._reader.pointerCount = local_1b0._reader.pointerCount;
  node_00._reader._38_2_ = local_1b0._reader._38_2_;
  node_00._reader.nestingLimit = local_1b0._reader.nestingLimit;
  node_00._reader._44_4_ = local_1b0._reader._44_4_;
  AVar2 = makeUncheckedNode(this,node_00);
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)local_118);
  return AVar2;
}

Assistant:

kj::ArrayPtr<word> SchemaLoader::Impl::rewriteStructNodeWithSizes(
    schema::Node::Reader node, uint dataWordCount, uint pointerCount) {
  MallocMessageBuilder builder;
  builder.setRoot(node);

  auto root = builder.getRoot<schema::Node>();
  auto newStruct = root.getStruct();
  newStruct.setDataWordCount(kj::max(newStruct.getDataWordCount(), dataWordCount));
  newStruct.setPointerCount(kj::max(newStruct.getPointerCount(), pointerCount));

  return makeUncheckedNode(root);
}